

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void add_block(storage *st,string *data)

{
  block *this;
  bool bVar1;
  undefined1 local_178 [8];
  block last;
  block local_98;
  uint64_t local_28;
  uint64_t num;
  
  local_98.prevsha256._M_dataplus._M_p = (pointer)&local_98.prevsha256.field_2;
  local_98.idx = 0;
  local_98.timestamp = 0;
  local_98.prevsha256._M_string_length = 0;
  local_98.prevsha256.field_2._M_local_buf[0] = '\0';
  local_98.data._M_dataplus._M_p = (pointer)&local_98.data.field_2;
  local_98.data._M_string_length = 0;
  local_98.data.field_2._M_local_buf[0] = '\0';
  local_98.sha256._M_dataplus._M_p = (pointer)&local_98.sha256.field_2;
  local_98.sha256._M_string_length = 0;
  local_98.sha256.field_2._M_local_buf[0] = '\0';
  bVar1 = storage::empty(st);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)(last.sha256.field_2._M_local_buf + 8),"",(allocator *)&local_28);
    new_block((block *)local_178,(string *)((long)&last.sha256.field_2 + 8),0,
              (data->_M_dataplus)._M_p,data->_M_string_length);
    block::operator=(&local_98,(block *)local_178);
    block::~block((block *)local_178);
    std::__cxx11::string::~string((string *)(last.sha256.field_2._M_local_buf + 8));
    storage::write_block(st,&local_98);
  }
  else {
    local_28 = 0;
    storage::last_block((block *)local_178,st,&local_28);
    new_block((block *)((long)&last.sha256.field_2 + 8),(string *)((long)&last.data.field_2 + 8),
              local_28,(data->_M_dataplus)._M_p,data->_M_string_length);
    this = (block *)((long)&last.sha256.field_2 + 8);
    block::operator=(&local_98,this);
    block::~block(this);
    storage::write_block(st,&local_98);
    block::~block((block *)local_178);
  }
  block::~block(&local_98);
  return;
}

Assistant:

void add_block(storage &st, const std::string &data) {
    block b{};
    if ( st.empty() ) {
        b = new_block("", 0, data.data(), data.size());
        st.add(b);
    } else {
        std::uint64_t num{};
        block last = st.last_block(&num);
        b = new_block(last.sha256, num, data.data(), data.size());
        st.add(b);
    }
}